

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::ReleaseMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  LogMessage *other;
  MessageLite *pMVar4;
  long lVar5;
  int iVar6;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar3 = this->extensions_offset_;
    if (iVar3 == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,other);
      LogMessage::~LogMessage(&local_60);
      iVar3 = this->extensions_offset_;
    }
    pMVar4 = ExtensionSet::ReleaseMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar3),field,
                        factory);
  }
  else {
    lVar5 = ((long)field - *(long *)(*(long *)(field + 0x38) + 0x30) >> 3) * -0x1111111111111111;
    bVar2 = (byte)lVar5 & 0x1f;
    iVar3 = (int)lVar5;
    iVar6 = iVar3 + 0x1f;
    if (-1 < iVar3) {
      iVar6 = iVar3;
    }
    puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (long)(iVar6 >> 5) * 4 + (long)this->has_bits_offset_);
    *puVar1 = *puVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
    pMVar4 = *(MessageLite **)
              ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)this->offsets_[iVar3]);
    *(undefined8 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)this->offsets_[iVar3]) = 0;
  }
  return (Message *)pMVar4;
}

Assistant:

Message* GeneratedMessageReflection::ReleaseMessage(
    Message* message,
    const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseMessage(field, factory));
  } else {
    ClearBit(message, field);
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = NULL;
    return ret;
  }
}